

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_MD5.cc
# Opt level: O0

ssize_t __thiscall Pl_MD5::write(Pl_MD5 *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  Pipeline *pPVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  size_t sVar3;
  uchar *local_48;
  size_t bytes;
  uchar *data;
  size_t bytes_left;
  size_t len_local;
  uchar *buf_local;
  Pl_MD5 *this_local;
  
  sVar3 = CONCAT44(in_register_00000034,__fd);
  if ((this->enabled & 1U) != 0) {
    bytes = sVar3;
    data = (uchar *)__buf;
    if ((this->in_progress & 1U) == 0) {
      MD5::reset(&this->md5);
      this->in_progress = true;
    }
    for (; data != (uchar *)0x0; data = data + -(long)local_48) {
      if (data < (uchar *)0x40000000) {
        local_48 = data;
      }
      else {
        local_48 = (uchar *)0x40000000;
      }
      MD5::encodeDataIncrementally(&this->md5,(char *)bytes,(size_t)local_48);
      bytes = (size_t)(local_48 + bytes);
    }
  }
  pPVar2 = Pipeline::next(&this->super_Pipeline);
  iVar1 = (*pPVar2->_vptr_Pipeline[2])(pPVar2,sVar3,__buf);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

void
Pl_MD5::write(unsigned char const* buf, size_t len)
{
    if (this->enabled) {
        if (!this->in_progress) {
            this->md5.reset();
            this->in_progress = true;
        }

        // Write in chunks in case len is too big to fit in an int. Assume int is at least 32 bits.
        static size_t const max_bytes = 1 << 30;
        size_t bytes_left = len;
        unsigned char const* data = buf;
        while (bytes_left > 0) {
            size_t bytes = (bytes_left >= max_bytes ? max_bytes : bytes_left);
            this->md5.encodeDataIncrementally(reinterpret_cast<char const*>(data), bytes);
            bytes_left -= bytes;
            data += bytes;
        }
    }

    next()->write(buf, len);
}